

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

Mem_Step_t * Mem_StepStart(int nSteps)

{
  int iVar1;
  Mem_Step_t *pMVar2;
  Mem_Fixed_t **ppMVar3;
  Mem_Fixed_t *pMVar4;
  Mem_Fixed_t **ppMVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  pMVar2 = (Mem_Step_t *)calloc(1,0x30);
  pMVar2->nMems = nSteps;
  ppMVar3 = (Mem_Fixed_t **)malloc((long)nSteps * 8);
  pMVar2->pMems = ppMVar3;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < nSteps) {
    uVar7 = (ulong)(uint)nSteps;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pMVar4 = Mem_FixedStart(8 << ((byte)uVar8 & 0x1f));
    ppMVar3[uVar8] = pMVar4;
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pMVar2->nMapSize = iVar1;
  ppMVar5 = (Mem_Fixed_t **)malloc((long)(iVar1 + 1) << 3);
  *ppMVar5 = (Mem_Fixed_t *)0x0;
  pMVar2->pMap = ppMVar5;
  pMVar4 = *ppMVar3;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    ppMVar5[lVar6 + 1] = pMVar4;
  }
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (lVar6 = (long)((4 << ((byte)uVar8 & 0x1f)) + 1); lVar6 <= 8 << ((byte)uVar8 & 0x1f);
        lVar6 = lVar6 + 1) {
      ppMVar5[lVar6] = ppMVar3[uVar8];
    }
  }
  return pMVar2;
}

Assistant:

Mem_Step_t * Mem_StepStart( int nSteps )
{
    Mem_Step_t * p;
    int i, k;
    p = ABC_ALLOC( Mem_Step_t, 1 );
    memset( p, 0, sizeof(Mem_Step_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Mem_Fixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Mem_FixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Mem_Fixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}